

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICMakeFiles.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_76d621::CMakeFiles::CMakeFiles
          (CMakeFiles *this,cmFileAPI *fileAPI,unsigned_long version)

{
  bool bVar1;
  string *psVar2;
  cmake *pcVar3;
  unsigned_long version_local;
  cmFileAPI *fileAPI_local;
  CMakeFiles *this_local;
  
  this->FileAPI = fileAPI;
  this->Version = version;
  psVar2 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
  std::operator+(&this->CMakeModules,psVar2,"/Modules");
  pcVar3 = cmFileAPI::GetCMakeInstance(this->FileAPI);
  psVar2 = cmake::GetHomeDirectory_abi_cxx11_(pcVar3);
  this->TopSource = psVar2;
  pcVar3 = cmFileAPI::GetCMakeInstance(this->FileAPI);
  psVar2 = cmake::GetHomeOutputDirectory_abi_cxx11_(pcVar3);
  this->TopBuild = psVar2;
  bVar1 = std::operator!=(this->TopBuild,this->TopSource);
  this->OutOfSource = bVar1;
  return;
}

Assistant:

CMakeFiles::CMakeFiles(cmFileAPI& fileAPI, unsigned long version)
  : FileAPI(fileAPI)
  , Version(version)
  , CMakeModules(cmSystemTools::GetCMakeRoot() + "/Modules")
  , TopSource(this->FileAPI.GetCMakeInstance()->GetHomeDirectory())
  , TopBuild(this->FileAPI.GetCMakeInstance()->GetHomeOutputDirectory())
  , OutOfSource(TopBuild != TopSource)
{
  static_cast<void>(this->Version);
}